

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_stqcx_be_parallel
                   (CPUPPCState_conflict2 *env,target_ulong addr,uint64_t new_lo,uint64_t new_hi,
                   uint32_t opidx)

{
  undefined1 cmpv_00 [16];
  undefined1 a [16];
  undefined1 newv_00 [16];
  undefined1 b [16];
  Int128 *addr_00;
  Int128 *retaddr;
  uint64_t hi;
  undefined8 unaff_retaddr;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  Int128 newv;
  Int128 cmpv;
  Int128 oldv;
  _Bool local_2d;
  _Bool success;
  uint32_t opidx_local;
  uint64_t new_hi_local;
  uint64_t new_lo_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  local_2d = false;
  if (addr == env->reserve_addr) {
    addr_00 = int128_make128((Int128 *)env->reserve_val2,env->reserve_val,new_lo);
    retaddr = int128_make128((Int128 *)new_lo,new_hi,hi);
    cmpv_00._4_4_ = in_stack_ffffffffffffff1c;
    cmpv_00._0_4_ = opidx;
    cmpv_00._8_8_ = unaff_retaddr;
    newv_00._8_8_ = in_stack_ffffffffffffff30;
    newv_00._0_8_ = in_stack_ffffffffffffff28;
    helper_atomic_cmpxchgo_be_mmu_ppc64
              ((Int128 *)env,(CPUArchState_conflict21 *)addr,(target_ulong)addr_00,(Int128)cmpv_00,
               (Int128)newv_00,(TCGMemOpIdx)hi,(uintptr_t)retaddr);
    a._4_4_ = in_stack_ffffffffffffff1c;
    a._0_4_ = opidx;
    a._8_8_ = unaff_retaddr;
    b._8_8_ = hi;
    b._0_8_ = addr_00;
    local_2d = int128_eq((Int128)a,(Int128)b);
  }
  env->reserve_addr = 0xffffffffffffffff;
  return (int)env->so + (uint)local_2d;
}

Assistant:

uint32_t helper_stqcx_be_parallel(CPUPPCState *env, target_ulong addr,
                                  uint64_t new_lo, uint64_t new_hi,
                                  uint32_t opidx)
{
    bool success = false;

    /* We will have raised EXCP_ATOMIC from the translator.  */
    assert(HAVE_CMPXCHG128);

    if (likely(addr == env->reserve_addr)) {
        Int128 oldv, cmpv, newv;

        cmpv = int128_make128(env->reserve_val2, env->reserve_val);
        newv = int128_make128(new_lo, new_hi);
        oldv = helper_atomic_cmpxchgo_be_mmu(env, addr, cmpv, newv,
                                             opidx, GETPC());
        success = int128_eq(oldv, cmpv);
    }
    env->reserve_addr = -1;
    return env->so + success * CRF_EQ_BIT;
}